

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O1

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::List,_(ritobin::Category)6>::from_json
          (ErrorStackOption *__return_storage_ptr__,List *value,json *json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  const_iterator cVar3;
  const_reference pvVar4;
  reference json_00;
  reference value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  _Rb_tree_header *type;
  size_t index;
  json_impl *this;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  string_view type_name;
  string valueType_name;
  const_iterator __begin3;
  const_iterator __end3;
  string local_148;
  size_type *local_128;
  string local_120;
  vector<ritobin::Element,std::allocator<ritobin::Element>> *local_100;
  string local_f8;
  undefined1 local_d8 [16];
  char local_c8 [16];
  char local_b8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  const_iterator local_70;
  const_iterator local_50;
  
  if (json->m_type == object) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ::_M_find_tr<char[10],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        *)(json->m_value).object,(char (*) [10])"valueType");
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pcVar6 = "json.contains(\"valueType\")";
    }
    else {
      if (json->m_type == object) {
        cVar3 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                ::_M_find_tr<char[6],void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                            *)(json->m_value).object,(char (*) [6])"items");
        type = &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)cVar3._M_node != type) {
          pvVar4 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)json,"valueType");
          if (pvVar4->m_type == string) {
            pvVar4 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)json,"items");
            if (pvVar4->m_type == array) {
              pvVar4 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)json,"valueType");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_90,pvVar4);
              type_name._M_str = (char *)value;
              type_name._M_len = (size_t)local_90._M_dataplus._M_p;
              bVar2 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                      ::try_type_name_to_type
                                ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                                  *)local_90._M_string_length,type_name,(Type *)type);
              if (bVar2) {
                pvVar4 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)json,"items");
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::cbegin(&local_70,pvVar4);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::cend(&local_50,pvVar4);
                local_100 = (vector<ritobin::Element,std::allocator<ritobin::Element>> *)
                            &value->items;
                local_128 = (size_type *)
                            ((long)&(__return_storage_ptr__->
                                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                    )._M_payload.
                                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>
                                    ._M_payload + 0x20);
                this = (json_impl *)0x0;
                while( true ) {
                  bVar2 = nlohmann::detail::
                          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::operator==(&local_70,&local_50);
                  if (bVar2) break;
                  json_00 = nlohmann::detail::
                            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::operator*(&local_70);
                  ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                  ::type_to_value((Value *)local_d8,value->valueType);
                  value_00 = std::vector<ritobin::Element,std::allocator<ritobin::Element>>::
                             emplace_back<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>
                                       (local_100,
                                        (variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         *)local_d8);
                  std::__detail::__variant::
                  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                  ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                       *)local_d8);
                  item_from_json(__return_storage_ptr__,value_00,json_00);
                  bVar2 = (__return_storage_ptr__->
                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                          _M_payload.
                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                          .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                          _M_engaged;
                  if (bVar2 == true) {
                    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"items","");
                    to_index((string *)local_d8,&local_f8);
                    to_index_abi_cxx11_(&local_120,this,index);
                    pcVar6 = (char *)0xf;
                    if ((char *)local_d8._0_8_ != local_c8) {
                      pcVar6 = (char *)local_c8._0_8_;
                    }
                    if (pcVar6 < (char *)(local_120._M_string_length + local_d8._8_8_)) {
                      uVar7 = (char *)0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_120._M_dataplus._M_p != &local_120.field_2) {
                        uVar7 = local_120.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar7 < (char *)(local_120._M_string_length + local_d8._8_8_))
                      goto LAB_00124201;
                      pbVar5 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               replace(&local_120,0,0,(char *)local_d8._0_8_,local_d8._8_8_);
                    }
                    else {
LAB_00124201:
                      pbVar5 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_d8,local_120._M_dataplus._M_p,
                                         local_120._M_string_length);
                    }
                    local_148._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                    paVar1 = &pbVar5->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p == paVar1) {
                      local_148.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                      local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    }
                    else {
                      local_148.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                    }
                    local_148._M_string_length = pbVar5->_M_string_length;
                    (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
                    pbVar5->_M_string_length = 0;
                    paVar1->_M_local_buf[0] = '\0';
                    ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_148);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != &local_148.field_2) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_120._M_dataplus._M_p != &local_120.field_2) {
                      operator_delete(local_120._M_dataplus._M_p,
                                      (ulong)(local_120.field_2._M_allocated_capacity + 1));
                    }
                    if ((char *)local_d8._0_8_ != local_c8) {
                      operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
                    }
                    uVar7 = local_f8.field_2._M_allocated_capacity;
                    _Var8._M_p = local_f8._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_00124303:
                      operator_delete(_Var8._M_p,uVar7 + 1);
                    }
                  }
                  else if ((__return_storage_ptr__->
                           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                           _M_payload.
                           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                           .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                           _M_engaged == true) {
                    (__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged =
                         false;
                    _Var8._M_p = (__return_storage_ptr__->
                                 super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                 .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                                 _M_payload._M_value.path._M_dataplus._M_p;
                    if ((size_type *)_Var8._M_p != local_128) {
                      uVar7 = *local_128;
                      goto LAB_00124303;
                    }
                  }
                  if (bVar2 != false) goto LAB_001244a4;
                  this = this + 1;
                  nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator++(&local_70);
                }
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
              }
              else {
                local_c8._0_8_ = local_b8;
                local_d8._0_8_ = "list";
                local_d8._8_8_ =
                     "ValueHelper::try_type_name_to_type(valueType_name, value.valueType)";
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .type = "list";
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .message = "ValueHelper::try_type_name_to_type(valueType_name, value.valueType)";
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .path._M_dataplus._M_p =
                     (pointer)((long)&(__return_storage_ptr__->
                                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>
                                      ._M_payload + 0x20);
                *(undefined1 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                         _M_payload.
                         super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                         .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                         _M_payload + 0x20) = 0;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                         _M_payload.
                         super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                         .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                         _M_payload._M_value.path.field_2 + 1) = local_b8._1_8_;
                *(undefined4 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                         _M_payload.
                         super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                         .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                         _M_payload + 0x29) = local_b8._9_4_;
                *(undefined2 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                         _M_payload.
                         super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                         .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                         _M_payload + 0x2d) = local_b8._13_2_;
                *(char *)((long)&(__return_storage_ptr__->
                                 super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                 .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                                 _M_payload + 0x2f) = local_b8[0xf];
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .path._M_string_length = 0;
                local_c8[8] = '\0';
                local_c8[9] = '\0';
                local_c8[10] = '\0';
                local_c8[0xb] = '\0';
                local_c8[0xc] = '\0';
                local_c8[0xd] = '\0';
                local_c8[0xe] = '\0';
                local_c8[0xf] = '\0';
                local_b8[0] = 0;
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
              }
LAB_001244a4:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p == &local_90.field_2) {
                return __return_storage_ptr__;
              }
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
              return __return_storage_ptr__;
            }
            pcVar6 = "json[\"items\"].is_array()";
          }
          else {
            pcVar6 = "json[\"valueType\"].is_string()";
          }
          goto LAB_001243b3;
        }
      }
      pcVar6 = "json.contains(\"items\")";
    }
  }
  else {
    pcVar6 = "json.is_object()";
  }
LAB_001243b3:
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type = "list"
  ;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
       pcVar6;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_dataplus._M_p =
       (pointer)((long)&(__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload
                + 0x20);
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path
           .field_2 + 1) = local_b8._1_8_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x29) =
       local_b8._9_4_;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2d) =
       local_b8._13_2_;
  *(char *)((long)&(__return_storage_ptr__->
                   super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                   _M_payload.
                   super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                   super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload +
           0x2f) = local_b8[0xf];
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_string_length = 0;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("valueType"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(json["valueType"].is_string());
            bin_json_assert(json["items"].is_array());
            std::string valueType_name = json["valueType"];
            bin_json_assert(ValueHelper::try_type_name_to_type(valueType_name, value.valueType));
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back(ValueHelper::type_to_value(value.valueType));
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }